

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str-util.cc
# Opt level: O0

string * tinyusdz::detail::extract_utf8_char
                   (string *__return_storage_ptr__,string *str,uint32_t start_i,int *len)

{
  byte bVar1;
  ulong uVar2;
  byte *pbVar3;
  uchar c;
  int *len_local;
  uint32_t start_i_local;
  string *str_local;
  
  *len = 0;
  uVar2 = ::std::__cxx11::string::size();
  if (uVar2 < start_i + 1) {
    *len = 0;
    ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    pbVar3 = (byte *)::std::__cxx11::string::operator[]((ulong)str);
    bVar1 = *pbVar3;
    if (bVar1 < 0x80) {
      *len = 1;
      ::std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)str);
    }
    else if ((bVar1 & 0xe0) == 0xc0) {
      uVar2 = ::std::__cxx11::string::size();
      if (uVar2 < start_i + 2) {
        *len = 0;
        ::std::__cxx11::string::string((string *)__return_storage_ptr__);
      }
      else {
        *len = 2;
        ::std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)str);
      }
    }
    else if ((bVar1 & 0xf0) == 0xe0) {
      uVar2 = ::std::__cxx11::string::size();
      if (uVar2 < start_i + 3) {
        *len = 0;
        ::std::__cxx11::string::string((string *)__return_storage_ptr__);
      }
      else {
        *len = 3;
        ::std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)str);
      }
    }
    else if ((bVar1 & 0xf8) == 0xf0) {
      uVar2 = ::std::__cxx11::string::size();
      if (uVar2 < start_i + 4) {
        *len = 0;
        ::std::__cxx11::string::string((string *)__return_storage_ptr__);
      }
      else {
        *len = 4;
        ::std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)str);
      }
    }
    else {
      *len = 0;
      ::std::__cxx11::string::string((string *)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string extract_utf8_char(const std::string &str, uint32_t start_i,
                                     int &len) {
  len = 0;

  if ((start_i + 1) > str.size()) {
    len = 0;
    return std::string();
  }

  unsigned char c = static_cast<unsigned char>(str[start_i]);

  if (c <= 127) {
    // ascii
    len = 1;
    return str.substr(start_i, 1);
  } else if ((c & 0xE0) == 0xC0) {
    if ((start_i + 2) > str.size()) {
      len = 0;
      return std::string();
    }
    len = 2;
    return str.substr(start_i, 2);
  } else if ((c & 0xF0) == 0xE0) {
    if ((start_i + 3) > str.size()) {
      len = 0;
      return std::string();
    }
    len = 3;
    return str.substr(start_i, 3);
  } else if ((c & 0xF8) == 0xF0) {
    if ((start_i + 4) > str.size()) {
      len = 0;
      return std::string();
    }
    len = 4;
    return str.substr(start_i, 4);
  } else {
    // invalid utf8
    len = 0;
    return std::string();
  }
}